

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O3

void __thiscall
TasGrid::DynamicConstructorDataGlobal::restrictData
          (DynamicConstructorDataGlobal *this,int ibegin,int iend)

{
  _Fwd_list_node_base *p_Var1;
  _Fwd_list_node_base *p_Var2;
  _Fwd_list_node_base *p_Var3;
  allocator_type local_49;
  _Fwd_list_node_base *local_48;
  _Fwd_list_node_base *p_Stack_40;
  _Fwd_list_node_base *local_38;
  
  p_Var3 = (this->data).super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>.
           _M_impl._M_head._M_next;
  if (p_Var3 != (_Fwd_list_node_base *)0x0) {
    do {
      ::std::vector<double,std::allocator<double>>::
      vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                ((vector<double,std::allocator<double>> *)&local_48,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 (p_Var3[4]._M_next + ibegin),
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 (p_Var3[4]._M_next + iend),&local_49);
      p_Var1 = p_Var3[4]._M_next;
      p_Var2 = p_Var3[6]._M_next;
      p_Var3[4]._M_next = local_48;
      p_Var3[5]._M_next = p_Stack_40;
      p_Var3[6]._M_next = local_38;
      local_48 = (_Fwd_list_node_base *)0x0;
      p_Stack_40 = (_Fwd_list_node_base *)0x0;
      local_38 = (_Fwd_list_node_base *)0x0;
      if (p_Var1 != (_Fwd_list_node_base *)0x0) {
        operator_delete(p_Var1,(long)p_Var2 - (long)p_Var1);
        if (local_48 != (_Fwd_list_node_base *)0x0) {
          operator_delete(local_48,(long)local_38 - (long)local_48);
        }
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_Fwd_list_node_base *)0x0);
  }
  return;
}

Assistant:

void restrictData(int ibegin, int iend){ for(auto &d : data) d.value = std::vector<double>(d.value.begin() + ibegin, d.value.begin() + iend); }